

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O1

void __thiscall Fl_Text_Buffer::text(Fl_Text_Buffer *this,char *t)

{
  int iVar1;
  char *__dest;
  char *pcVar2;
  size_t sVar3;
  char *__s;
  int iVar4;
  long lVar5;
  
  __s = "";
  if (t != (char *)0x0) {
    __s = t;
  }
  if (0 < this->mNPredeleteProcs) {
    iVar1 = this->mLength;
    lVar5 = 0;
    do {
      (*this->mPredeleteProcs[lVar5])(0,iVar1,this->mPredeleteCbArgs[lVar5]);
      lVar5 = lVar5 + 1;
    } while (lVar5 < this->mNPredeleteProcs);
  }
  iVar1 = this->mLength;
  lVar5 = (long)iVar1;
  __dest = (char *)malloc(lVar5 + 1);
  pcVar2 = this->mBuf;
  sVar3 = (size_t)this->mGapStart;
  memcpy(__dest,pcVar2,sVar3);
  memcpy(__dest + sVar3,pcVar2 + this->mGapEnd,lVar5 - sVar3);
  __dest[lVar5] = '\0';
  free(pcVar2);
  sVar3 = strlen(__s);
  iVar4 = (int)sVar3;
  sVar3 = (long)this->mPreferredGapSize + (long)iVar4;
  pcVar2 = (char *)malloc(sVar3);
  this->mBuf = pcVar2;
  this->mLength = iVar4;
  this->mGapStart = iVar4;
  this->mGapEnd = (int)sVar3;
  memcpy(pcVar2,__s,(long)iVar4);
  update_selections(this,0,iVar1,0);
  if (0 < this->mNModifyProcs) {
    lVar5 = 0;
    do {
      (*this->mModifyProcs[lVar5])(0,iVar4,iVar1,0,__dest,this->mCbArgs[lVar5]);
      lVar5 = lVar5 + 1;
    } while (lVar5 < this->mNModifyProcs);
  }
  free(__dest);
  return;
}

Assistant:

void Fl_Text_Buffer::text(const char *t)
{
  IS_UTF8_ALIGNED(t)

  // if t is null then substitute it with an empty string
  // then don't return so that internal cleanup can happen
  if (!t) t="";

  call_predelete_callbacks(0, length());
  
  /* Save information for redisplay, and get rid of the old buffer */
  const char *deletedText = text();
  int deletedLength = mLength;
  free((void *) mBuf);
  
  /* Start a new buffer with a gap of mPreferredGapSize at the end */
  int insertedLength = (int) strlen(t);
  mBuf = (char *) malloc(insertedLength + mPreferredGapSize);
  mLength = insertedLength;
  mGapStart = insertedLength;
  mGapEnd = mGapStart + mPreferredGapSize;
  memcpy(mBuf, t, insertedLength);
  
  /* Zero all of the existing selections */
  update_selections(0, deletedLength, 0);
  
  /* Call the saved display routine(s) to update the screen */
  call_modify_callbacks(0, deletedLength, insertedLength, 0, deletedText);
  free((void *) deletedText);
}